

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_json_purify_len(char *string)

{
  char *local_20;
  char *p;
  int len;
  char *string_local;
  
  p._4_4_ = 0;
  local_20 = string;
  while (*local_20 != '\0') {
    if (((*local_20 == '\t') || (*local_20 == '\n')) || (*local_20 == '\r')) {
      local_20 = local_20 + 1;
      p._4_4_ = p._4_4_ + 2;
    }
    else if (((*local_20 == '\"') || (*local_20 == '\\')) || (*local_20 < ' ')) {
      p._4_4_ = p._4_4_ + 6;
      local_20 = local_20 + 1;
    }
    else {
      local_20 = local_20 + 1;
      p._4_4_ = p._4_4_ + 1;
    }
  }
  return p._4_4_;
}

Assistant:

int
lws_json_purify_len(const char *string)
{
	int len = 0;
	const char *p = string;

	while (*p) {
		if (*p == '\t' || *p == '\n' || *p == '\r') {
			p++;
			len += 2;
			continue;
		}

		if (*p == '\"' || *p == '\\' || *p < 0x20) {
			len += 6;
			p++;
			continue;
		}
		p++;
		len++;
	}

	return len;
}